

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

int lest::run(tests *specification,int argc,char **argv,ostream *os)

{
  ostream *__last;
  int iVar1;
  ostream *__first;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_59;
  texts local_58;
  vector<lest::test,_std::allocator<lest::test>_> local_40;
  ostream *local_28;
  ostream *os_local;
  char **argv_local;
  tests *ptStack_10;
  int argc_local;
  tests *specification_local;
  
  local_28 = os;
  os_local = (ostream *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = specification;
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_40,specification);
  __first = os_local + 8;
  __last = os_local + (long)argv_local._4_4_ * 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_59);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
             (char **)__first,(char **)__last,&local_59);
  iVar1 = run(&local_40,&local_58,local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_59);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  return iVar1;
}

Assistant:

inline int run( tests specification, int argc, char * argv[], std::ostream & os = std::cout )
{
    return run( specification, texts( argv + 1, argv + argc ), os  );
}